

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# directed_flag_complex.h
# Opt level: O2

void __thiscall
directed_flag_complex_t::worker_thread<directed_flag_complex_computer::reorder_edges_t>
          (directed_flag_complex_t *this,size_t number_of_threads,int thread_id,reorder_edges_t *f,
          int min_dimension,int max_dimension)

{
  ushort uVar1;
  int max_dimension_00;
  ulong uVar2;
  undefined4 in_register_0000008c;
  vector<unsigned_short,_std::allocator<unsigned_short>_> prefix;
  vector<unsigned_short,_std::allocator<unsigned_short>_> first_position_vertices;
  allocator_type local_75;
  int local_74;
  reorder_edges_t *local_70;
  undefined8 local_68;
  _Vector_base<unsigned_short,_std::allocator<unsigned_short>_> local_60;
  _Vector_base<unsigned_short,_std::allocator<unsigned_short>_> local_48;
  
  local_68 = CONCAT44(in_register_0000008c,max_dimension);
  uVar1 = (this->graph->super_directed_graph_t).number_of_vertices;
  local_48._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_48._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_74 = min_dimension;
  local_70 = f;
  for (uVar2 = (ulong)thread_id; uVar2 < uVar1; uVar2 = uVar2 + number_of_threads) {
    local_60._M_impl.super__Vector_impl_data._M_start._0_2_ = (undefined2)uVar2;
    std::vector<unsigned_short,_std::allocator<unsigned_short>_>::emplace_back<unsigned_short>
              ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)&local_48,
               (unsigned_short *)&local_60);
  }
  max_dimension_00 = (int)local_68;
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::vector
            ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)&local_60,
             (long)(max_dimension_00 + 1),&local_75);
  do_for_each_cell<directed_flag_complex_computer::reorder_edges_t>
            (this,local_70,local_74,max_dimension_00,
             (vector<unsigned_short,_std::allocator<unsigned_short>_> *)&local_48,
             (vertex_index_t *)
             CONCAT62(local_60._M_impl.super__Vector_impl_data._M_start._2_6_,
                      local_60._M_impl.super__Vector_impl_data._M_start._0_2_),0);
  std::_Vector_base<unsigned_short,_std::allocator<unsigned_short>_>::~_Vector_base(&local_60);
  std::_Vector_base<unsigned_short,_std::allocator<unsigned_short>_>::~_Vector_base(&local_48);
  return;
}

Assistant:

void worker_thread(size_t number_of_threads, int thread_id, Func& f, int min_dimension, int max_dimension) {
		const size_t number_of_vertices = graph.vertex_number();

		std::vector<vertex_index_t> first_position_vertices;
		for (size_t index = thread_id; index < number_of_vertices; index += number_of_threads)
			first_position_vertices.push_back(vertex_index_t(index));

		std::vector<vertex_index_t> prefix(max_dimension + 1);

		do_for_each_cell(f, min_dimension, max_dimension, first_position_vertices, prefix.data(), 0);

		f.done();
	}